

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cc
# Opt level: O3

RC __thiscall
StatisticsMgr::Register(StatisticsMgr *this,char *psKey,Stat_Operation op,int *piValue)

{
  int *piVar1;
  uint uVar2;
  InternalNode *pIVar3;
  char *pcVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  InternalNode *this_00;
  InternalNode *this_01;
  uint uVar8;
  long lVar9;
  InternalNode **ppIVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  if (psKey == (char *)0x0) {
    return 0x2329;
  }
  if (op != STAT_ADDONE && piValue == (int *)0x0) {
    return 0x2329;
  }
  uVar2 = (this->llStats).iLength;
  if ((int)uVar2 < 1) {
    uVar13 = 0;
    this_00 = (InternalNode *)0x0;
LAB_00103ec3:
    if (uVar13 == uVar2) goto LAB_00103ec8;
    bVar5 = false;
  }
  else {
    uVar6 = (this->llStats).iLastRef;
    uVar13 = 0;
    do {
      uVar12 = uVar13 + 1;
      if (uVar6 == 0xffffffff) {
        lVar9 = (ulong)((int)(uVar2 - uVar12) <= (int)uVar12) * 8 + 8;
        uVar6 = uVar2;
        if ((int)uVar12 < (int)(uVar2 - uVar12)) {
          uVar6 = 1;
        }
      }
      else {
        uVar11 = uVar12 - uVar6;
        uVar8 = -uVar11;
        if (0 < (int)uVar11) {
          uVar8 = uVar11;
        }
        if (uVar12 < uVar8) {
          lVar9 = 8;
          uVar6 = 1;
        }
        else {
          lVar9 = (ulong)((int)uVar8 < (int)(uVar2 - uVar12)) * 8 + 0x10;
          if ((int)(uVar2 - uVar12) <= (int)uVar8) {
            uVar6 = uVar2;
          }
        }
      }
      this_00 = *(InternalNode **)((long)&(this->llStats).iLength + lVar9);
      for (; uVar6 != uVar12; uVar6 = uVar6 + (-(uint)((int)uVar13 < (int)uVar6) | 1)) {
        this_00 = (&this_00->next)[(int)uVar13 < (int)uVar6];
      }
      (this->llStats).iLastRef = uVar12;
      (this->llStats).pnLastRef = this_00;
      iVar7 = strcmp(psKey,(this_00->Data).psKey);
      if (iVar7 == 0) goto LAB_00103ec3;
      uVar6 = uVar12;
      uVar13 = uVar12;
    } while (uVar2 != uVar12);
LAB_00103ec8:
    this_00 = (InternalNode *)operator_new(0x10);
    bVar5 = true;
    Statistic::Statistic((Statistic *)this_00,psKey);
  }
  switch(op) {
  case STAT_ADDONE:
    piVar1 = &(this_00->Data).iValue;
    *piVar1 = *piVar1 + 1;
    break;
  case STAT_ADDVALUE:
    piVar1 = &(this_00->Data).iValue;
    *piVar1 = *piVar1 + *piValue;
    break;
  case STAT_SETVALUE:
    iVar7 = *piValue;
    goto LAB_00103f2b;
  case STAT_MULTVALUE:
    iVar7 = (this_00->Data).iValue * *piValue;
    goto LAB_00103f2b;
  case STAT_DIVVALUE:
    iVar7 = (this_00->Data).iValue / *piValue;
LAB_00103f2b:
    (this_00->Data).iValue = iVar7;
    break;
  case STAT_SUBVALUE:
    piVar1 = &(this_00->Data).iValue;
    *piVar1 = *piVar1 - *piValue;
  }
  if (bVar5) {
    this_01 = (InternalNode *)operator_new(0x20);
    (this_01->Data).psKey = (char *)0x0;
    (this_01->Data).iValue = 0;
    Statistic::operator=((Statistic *)this_01,&this_00->Data);
    this_01->next = (InternalNode *)0x0;
    pIVar3 = (this->llStats).pnTail;
    this_01->previous = pIVar3;
    iVar7 = (this->llStats).iLength;
    if (iVar7 == 0) {
      (this->llStats).pnHead = this_01;
      ppIVar10 = &(this->llStats).pnLastRef;
    }
    else {
      ppIVar10 = &pIVar3->next;
    }
    *ppIVar10 = this_01;
    (this->llStats).pnTail = this_01;
    (this->llStats).iLength = iVar7 + 1;
    pcVar4 = (this_00->Data).psKey;
    if (pcVar4 != (char *)0x0) {
      operator_delete__(pcVar4);
    }
    operator_delete(this_00);
  }
  return 0;
}

Assistant:

RC StatisticsMgr::Register (const char *psKey, const Stat_Operation op,
      const int *const piValue)
{
   int i, iCount;
   Statistic *pStat = NULL;

   if (psKey==NULL || (op != STAT_ADDONE && piValue == NULL))
      return STAT_INVALID_ARGS;

   iCount = llStats.GetLength();

   for (i=0; i < iCount; i++) {
      pStat = llStats[i];
      if (*pStat == psKey)
         break;
   }

   // Check to see if we found the Stat
   if (i==iCount)
      // We haven't found it so create a new statistic
      // with the key psKey and initial value of 0.
      pStat = new Statistic( psKey );

   // Now perform the operation over the statistic
   switch (op) {
      case STAT_ADDONE:
         pStat->iValue++;
         break;
      case STAT_ADDVALUE:
         pStat->iValue += *piValue;
         break;
      case STAT_SETVALUE:
         pStat->iValue = *piValue;
         break;
      case STAT_MULTVALUE:
         pStat->iValue *= *piValue;
         break;
      case STAT_DIVVALUE:
         pStat->iValue = (int) (pStat->iValue/(*piValue));
         break;
      case STAT_SUBVALUE:
         pStat->iValue -= *piValue;
         break;
   };

   // Finally, if the statistic wasn't in the original list then add it to
   // the list.
   //  JASON:: Confirm that it makes a copy of the object in line 229 of
   //  linkedlist.h.
   if (i==iCount) {
      llStats.Append(*pStat);
      delete pStat;
   }

   return 0;
}